

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCombinable.h
# Opt level: O2

void __thiscall
HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/mip/HighsCliqueTable.cpp:455:59)>
::~HighsCombinable(HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>
                   *this)

{
  PaddedData *__ptr;
  long lVar1;
  int i;
  long lVar2;
  
  if ((this->threadCopies_)._M_t.
      super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
      .
      super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
      ._M_head_impl != (PaddedData *)0x0) {
    lVar1 = 0x10;
    for (lVar2 = 0;
        __ptr = (this->threadCopies_)._M_t.
                super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                .
                super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
                ._M_head_impl, lVar2 < this->numThreads; lVar2 = lVar2 + 1) {
      if (*(char *)((long)__ptr + lVar1 + -0x10) == '\x01') {
        *(undefined1 *)((long)__ptr + lVar1 + -0x10) = 0;
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)(&__ptr->initialized_ + lVar1));
      }
      lVar1 = lVar1 + 0x40;
    }
    if (__ptr != (PaddedData *)0x0) {
      ::highs::cache_aligned::free(__ptr);
    }
  }
  (this->threadCopies_)._M_t.
  super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
  .
  super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
  ._M_head_impl = (PaddedData *)0x0;
  return;
}

Assistant:

~HighsCombinable() {
    if (threadCopies_) clear();
  }